

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quiet_result_printer_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  UnitTest *this;
  TestEventListeners *this_00;
  char *pcVar3;
  TestEventListener *pTVar4;
  UnitTestSource *this_01;
  char **in_R9;
  AssertionHelper local_11a8;
  int local_1178;
  AssertionReturnType<int> local_1174;
  Fixed local_1170;
  ReturnTypedFixed<int> local_fe8;
  undefined1 local_e58 [8];
  AssertionResult iutest_ar_4;
  int local_e00;
  AssertionReturnType<int> local_dfc;
  Fixed local_df8;
  ReturnTypedFixed<int> local_c70;
  char *local_ae0;
  undefined1 local_ad8 [8];
  AssertionResult iutest_ar_3;
  int local_a80;
  AssertionReturnType<int> local_a7c;
  Fixed local_a78;
  ReturnTypedFixed<int> local_8f0;
  char *local_760;
  undefined1 local_758 [8];
  AssertionResult iutest_ar_2;
  int local_700;
  AssertionReturnType<int> local_6fc;
  Fixed local_6f8;
  ReturnTypedFixed<int> local_570;
  undefined1 local_3e0 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_3b0;
  int local_380;
  AssertionReturnType<int> local_37c;
  Fixed local_378;
  ReturnTypedFixed<int> local_1f0;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  TestEventListener *listener;
  TestEventListeners *listeners;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  iutest::InitIrisUnitTest((int *)&argv_local,argv);
  iuutil::ReleaseDefaultXmlGenerator();
  if ((main::logger == '\0') && (iVar2 = __cxa_guard_acquire(&main::logger), iVar2 != 0)) {
    TestLogger::TestLogger(&main::logger);
    __cxa_atexit(TestLogger::~TestLogger,&main::logger,&__dso_handle);
    __cxa_guard_release(&main::logger);
  }
  iutest::detail::iuConsole::SetLogger(&main::logger.super_iuLogger);
  this = iutest::UnitTest::GetInstance();
  this_00 = iutest::UnitTest::listeners(this);
  iutest_ar._32_8_ = iuutil::QuietResultPrinter::SetUp();
  iutest::detail::AlwaysZero();
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestEventListener>
            ((AssertionResult *)local_50,"(listener)",(TestEventListener *)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_378,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_378);
    local_380 = 1;
    local_37c = iutest::AssertionReturn<int>(&local_380);
    iutest::AssertionHelper::Fixed::operator<<(&local_1f0,&local_378,&local_37c);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_50);
    iutest::AssertionHelper::AssertionHelper
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
               ,0x32,pcVar3,kFatalFailure);
    argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_3b0,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_3b0);
    iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_378);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    pTVar4 = iutest::TestEventListeners::default_result_printer(this_00);
    iutest::internal::NullHelper<false>::CompareEq<iutest::TestEventListener>
              ((AssertionResult *)local_3e0,"(listeners.default_result_printer())",pTVar4);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar1) {
      memset(&local_6f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_6f8);
      local_700 = 1;
      local_6fc = iutest::AssertionReturn<int>(&local_700);
      iutest::AssertionHelper::Fixed::operator<<(&local_570,&local_6f8,&local_6fc);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_3e0);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                 ,0x33,pcVar3,kFatalFailure);
      argv_local._4_4_ =
           iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_570);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_570);
      iutest::AssertionHelper::Fixed::~Fixed(&local_6f8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    if (iutest_ar_1._36_4_ == 0) {
      this_01 = iutest::UnitTestSource::GetInstance();
      iVar2 = iutest::UnitTestSource::Run(this_01);
      if (iVar2 == 0) {
        argv_local._4_4_ = 1;
      }
      else {
        iutest::detail::AlwaysZero();
        local_760 = TestLogger::c_str(&main::logger);
        iuutil::CmpHelperSTRNOTIN<char[13],char_const*>
                  ((AssertionResult *)local_758,(iuutil *)"\"[       OK ]\"","logger.c_str()",
                   "[       OK ]",(char (*) [13])&local_760,in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
        if (!bVar1) {
          memset(&local_a78,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_a78);
          local_a80 = 1;
          local_a7c = iutest::AssertionReturn<int>(&local_a80);
          iutest::AssertionHelper::Fixed::operator<<(&local_8f0,&local_a78,&local_a7c);
          pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_758);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_3.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                     ,0x3e,pcVar3,kFatalFailure);
          argv_local._4_4_ =
               iutest::AssertionHelper::operator=
                         ((AssertionHelper *)&iutest_ar_3.m_result,&local_8f0);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
          iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_8f0);
          iutest::AssertionHelper::Fixed::~Fixed(&local_a78);
        }
        iutest_ar_1._37_3_ = 0;
        iutest_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_758);
        if (iutest_ar_1._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          local_ae0 = TestLogger::c_str(&main::logger);
          iuutil::CmpHelperSTRIN<char[13],char_const*>
                    ((AssertionResult *)local_ad8,(iuutil *)"\"[  FAILED  ]\"","logger.c_str()",
                     "[  FAILED  ]",(char (*) [13])&local_ae0,in_R9);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
          if (!bVar1) {
            memset(&local_df8,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_df8);
            local_e00 = 1;
            local_dfc = iutest::AssertionReturn<int>(&local_e00);
            iutest::AssertionHelper::Fixed::operator<<(&local_c70,&local_df8,&local_dfc);
            pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_ad8);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_4.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                       ,0x3f,pcVar3,kFatalFailure);
            argv_local._4_4_ =
                 iutest::AssertionHelper::operator=
                           ((AssertionHelper *)&iutest_ar_4.m_result,&local_c70);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
            iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_c70);
            iutest::AssertionHelper::Fixed::~Fixed(&local_df8);
          }
          iutest_ar_1._37_3_ = 0;
          iutest_ar_1._36_1_ = !bVar1;
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
          if (iutest_ar_1._36_4_ == 0) {
            pTVar4 = iutest::TestEventListeners::Release
                               (this_00,(TestEventListener *)iutest_ar._32_8_);
            if (pTVar4 != (TestEventListener *)0x0) {
              (*pTVar4->_vptr_TestEventListener[1])();
            }
            iutest_ar._32_8_ = iuutil::QuietResultPrinter::SetUp();
            iutest::detail::AlwaysZero();
            iutest::internal::NullHelper<false>::CompareEq<iutest::TestEventListener>
                      ((AssertionResult *)local_e58,"(listener)",
                       (TestEventListener *)iutest_ar._32_8_);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e58);
            if (!bVar1) {
              memset(&local_1170,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_1170);
              local_1178 = 1;
              local_1174 = iutest::AssertionReturn<int>(&local_1178);
              iutest::AssertionHelper::Fixed::operator<<(&local_fe8,&local_1170,&local_1174);
              pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_e58);
              iutest::AssertionHelper::AssertionHelper
                        (&local_11a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                         ,0x46,pcVar3,kFatalFailure);
              argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_11a8,&local_fe8);
              iutest::AssertionHelper::~AssertionHelper(&local_11a8);
              iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_fe8);
              iutest::AssertionHelper::Fixed::~Fixed(&local_1170);
            }
            iutest_ar_1._37_3_ = 0;
            iutest_ar_1._36_1_ = !bVar1;
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
            if (iutest_ar_1._36_4_ == 0) {
              printf("*** Successful ***\n");
              argv_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

#if !defined(IUTEST_USE_GTEST)
    static TestLogger logger;
    ::iutest::detail::iuConsole::SetLogger(&logger);
#endif

    ::iutest::TestEventListeners& listeners = ::iutest::UnitTest::GetInstance()->listeners();
    ::iutest::TestEventListener* listener = ::iuutil::QuietResultPrinter::SetUp();
#if IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_NOTNULL( listener ) << ::iutest::AssertionReturn<int>(1);
    IUTEST_ASSERT_NULL( listeners.default_result_printer() ) << ::iutest::AssertionReturn<int>(1);
#else
    IUTEST_TERMINATE_ON_FAILURE(listener != NULL);
    IUTEST_TERMINATE_ON_FAILURE(listeners.default_result_printer() == NULL);
#endif

    if( IUTEST_RUN_ALL_TESTS() == 0 )
    {
        return 1;
    }
#if !defined(IUTEST_USE_GTEST) && IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_STRNOTIN("[       OK ]", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
    IUTEST_ASSERT_STRIN   ("[  FAILED  ]", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif


    delete listeners.Release(listener);
    listener = ::iuutil::QuietResultPrinter::SetUp();
#if IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_NULL( listener ) << ::iutest::AssertionReturn<int>(1);
#else
    if( listener != NULL )
    {
        return 1;
    }
#endif

    printf("*** Successful ***\n");
    return 0;
}